

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorPool::TryFindExtensionInFallbackDatabase
          (DescriptorPool *this,Descriptor *containing_type,int field_number)

{
  Tables *pTVar1;
  char *pcVar2;
  size_t size;
  int iVar3;
  const_iterator cVar4;
  FileDescriptor *pFVar5;
  bool bVar6;
  FileDescriptorProto file_proto;
  key_type local_110;
  FileDescriptorProto local_100;
  
  if (this->fallback_database_ == (DescriptorDatabase *)0x0) {
    return false;
  }
  FileDescriptorProto::FileDescriptorProto(&local_100,(Arena *)0x0,false);
  iVar3 = (*this->fallback_database_->_vptr_DescriptorDatabase[4])
                    (this->fallback_database_,*(long *)(containing_type + 8) + 0x20,
                     (ulong)(uint)field_number,&local_100);
  if ((char)iVar3 != '\0') {
    pTVar1 = (this->tables_)._M_t.
             super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl;
    pcVar2 = *(char **)((ulong)local_100.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    size = ((undefined8 *)((ulong)local_100.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffe))[1];
    if ((long)size < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
    }
    local_110.ptr_ = pcVar2;
    local_110.length_ = size;
    cVar4 = std::
            _Hashtable<google::protobuf::stringpiece_internal::StringPiece,_std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_std::equal_to<google::protobuf::stringpiece_internal::StringPiece>,_google::protobuf::hash<google::protobuf::stringpiece_internal::StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(pTVar1->files_by_name_)._M_h,&local_110);
    if ((cVar4.
         super__Node_iterator_base<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_true>
         ._M_cur == (__node_type *)0x0) ||
       (*(long *)((long)cVar4.
                        super__Node_iterator_base<std::pair<const_google::protobuf::stringpiece_internal::StringPiece,_const_google::protobuf::FileDescriptor_*>,_true>
                        ._M_cur + 0x18) == 0)) {
      pFVar5 = BuildFileFromDatabase(this,&local_100);
      bVar6 = pFVar5 != (FileDescriptor *)0x0;
      goto LAB_00346bc2;
    }
  }
  bVar6 = false;
LAB_00346bc2:
  FileDescriptorProto::~FileDescriptorProto(&local_100);
  return bVar6;
}

Assistant:

bool DescriptorPool::TryFindExtensionInFallbackDatabase(
    const Descriptor* containing_type, int field_number) const {
  if (fallback_database_ == nullptr) return false;

  FileDescriptorProto file_proto;
  if (!fallback_database_->FindFileContainingExtension(
          containing_type->full_name(), field_number, &file_proto)) {
    return false;
  }

  if (tables_->FindFile(file_proto.name()) != nullptr) {
    // We've already loaded this file, and it apparently doesn't contain the
    // extension we're looking for.  Some DescriptorDatabases return false
    // positives.
    return false;
  }

  if (BuildFileFromDatabase(file_proto) == nullptr) {
    return false;
  }

  return true;
}